

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

Array<capnp::Schema> * __thiscall
capnp::SchemaLoader::Impl::getAllLoaded(Array<capnp::Schema> *__return_storage_ptr__,Impl *this)

{
  Entry *pEVar1;
  Entry *schema;
  Entry *pEVar2;
  Schema *pSVar3;
  Entry *schema_1;
  long lVar4;
  size_t elementCount;
  
  elementCount = 0;
  for (pEVar2 = (this->schemas).table.rows.builder.ptr;
      pEVar2 != (this->schemas).table.rows.builder.pos; pEVar2 = pEVar2 + 1) {
    elementCount = elementCount + (pEVar2->value->lazyInitializer == (Initializer *)0x0);
  }
  pSVar3 = (Schema *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,elementCount,elementCount,
                      kj::_::HeapArrayDisposer::Allocate_<capnp::Schema,_false,_false>::construct,
                      kj::_::HeapArrayDisposer::Allocate_<capnp::Schema,_false,_false>::destruct);
  __return_storage_ptr__->ptr = pSVar3;
  __return_storage_ptr__->size_ = elementCount;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar2 = (this->schemas).table.rows.builder.ptr;
  pEVar1 = (this->schemas).table.rows.builder.pos;
  if (pEVar2 != pEVar1) {
    lVar4 = 0;
    do {
      if (pEVar2->value->lazyInitializer == (Initializer *)0x0) {
        pSVar3[lVar4].raw = &pEVar2->value->defaultBrand;
        lVar4 = lVar4 + 1;
      }
      pEVar2 = pEVar2 + 1;
    } while (pEVar2 != pEVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<Schema> SchemaLoader::Impl::getAllLoaded() const {
  size_t count = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) ++count;
  }

  kj::Array<Schema> result = kj::heapArray<Schema>(count);
  size_t i = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) {
      result[i++] = Schema(&schema.value->defaultBrand);
    }
  }
  return result;
}